

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlitePagerAcquire(Pager *pPager,pgno pgno,unqlite_page **ppPage,int fetchOnly,int noContent)

{
  int iVar1;
  Page *pPStack_38;
  int rc;
  Page *pPage;
  int noContent_local;
  int fetchOnly_local;
  unqlite_page **ppPage_local;
  pgno pgno_local;
  Pager *pPager_local;
  
  pPager_local._4_4_ = pager_shared_lock(pPager);
  if (pPager_local._4_4_ == 0) {
    pPStack_38 = pager_fetch_page(pPager,pgno);
    if (fetchOnly == 0) {
      if (pPStack_38 == (Page *)0x0) {
        pPStack_38 = pager_alloc_page(pPager,pgno);
        if (pPStack_38 == (Page *)0x0) {
          unqliteGenOutofMem(pPager->pDb);
          return -1;
        }
        iVar1 = pager_get_page_contents(pPager,pPStack_38,noContent);
        if (iVar1 != 0) {
          SyMemBackendPoolFree(pPager->pAllocator,pPStack_38);
          return iVar1;
        }
        pager_link_page(pPager,pPStack_38);
      }
      else if (ppPage != (unqlite_page **)0x0) {
        page_ref(pPStack_38);
      }
      if (ppPage != (unqlite_page **)0x0) {
        *ppPage = (unqlite_page *)pPStack_38;
      }
      pPager_local._4_4_ = 0;
    }
    else {
      if (ppPage != (unqlite_page **)0x0) {
        *ppPage = (unqlite_page *)pPStack_38;
      }
      pPager_local._4_4_ = -6;
      if (pPStack_38 != (Page *)0x0) {
        pPager_local._4_4_ = 0;
      }
    }
  }
  return pPager_local._4_4_;
}

Assistant:

static int unqlitePagerAcquire(
  Pager *pPager,      /* The pager open on the database file */
  pgno pgno,          /* Page number to fetch */
  unqlite_page **ppPage,    /* OUT: Acquired page */
  int fetchOnly,      /* Cache lookup only */
  int noContent       /* Do not bother reading content from disk if true */
)
{
	Page *pPage;
	int rc;
	/* Acquire a shared lock (if not yet done) on the database and rollback any hot-journal if present */
	rc = pager_shared_lock(pPager);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Fetch the page from the cache */
	pPage = pager_fetch_page(pPager,pgno);
	if( fetchOnly ){
		if( ppPage ){
			*ppPage = (unqlite_page *)pPage;
		}
		return pPage ? UNQLITE_OK : UNQLITE_NOTFOUND;
	}
	if( pPage == 0 ){
		/* Allocate a new page */
		pPage = pager_alloc_page(pPager,pgno);
		if( pPage == 0 ){
			unqliteGenOutofMem(pPager->pDb);
			return UNQLITE_NOMEM;
		}
		/* Read page contents */
		rc = pager_get_page_contents(pPager,pPage,noContent);
		if( rc != UNQLITE_OK ){
			SyMemBackendPoolFree(pPager->pAllocator,pPage);
			return rc;
		}
		/* Link the page */
		pager_link_page(pPager,pPage);
	}else{
		if( ppPage ){
			page_ref(pPage);
		}
	}
	/* All done, page is loaded in memeory */
	if( ppPage ){
		*ppPage = (unqlite_page *)pPage;
	}
	return UNQLITE_OK;
}